

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

uint8_t monster_health_attr(void)

{
  monster *mon_00;
  _Bool _Var1;
  int iVar2;
  uint8_t local_11;
  wchar_t pct;
  uint8_t attr;
  monster *mon;
  
  mon_00 = player->upkeep->health_who;
  if (mon_00 == (monster *)0x0) {
    local_11 = '\0';
  }
  else {
    _Var1 = monster_is_visible(mon_00);
    if (((_Var1) && (-1 < mon_00->hp)) && (player->timed[6] == 0)) {
      local_11 = '\x04';
      iVar2 = (int)(((long)mon_00->hp * 100) / (long)mon_00->maxhp);
      if (9 < iVar2) {
        local_11 = '\f';
      }
      if (0x18 < iVar2) {
        local_11 = '\x03';
      }
      if (0x3b < iVar2) {
        local_11 = '\v';
      }
      if (99 < iVar2) {
        local_11 = '\r';
      }
      if (mon_00->m_timed[3] != 0) {
        local_11 = '\x11';
      }
      if (mon_00->m_timed[7] != 0) {
        local_11 = '\x0f';
      }
      if (mon_00->m_timed[8] != 0) {
        local_11 = '\n';
      }
      if (mon_00->m_timed[2] != 0) {
        local_11 = '\a';
      }
      if (mon_00->m_timed[1] != 0) {
        local_11 = '\x0e';
      }
      if (mon_00->m_timed[0] != 0) {
        local_11 = '\x06';
      }
      if (mon_00->m_timed[6] != 0) {
        local_11 = '\x06';
      }
    }
    else {
      local_11 = '\x01';
    }
  }
  return local_11;
}

Assistant:

uint8_t monster_health_attr(void)
{
	struct monster *mon = player->upkeep->health_who;
	uint8_t attr;

	if (!mon) {
		/* Not tracking */
		attr = COLOUR_DARK;

	} else if (!monster_is_visible(mon) || mon->hp < 0 ||
			   player->timed[TMD_IMAGE]) {
		/* The monster health is "unknown" */
		attr = COLOUR_WHITE;

	} else {
		int pct;

		/* Default to almost dead */
		attr = COLOUR_RED;

		/* Extract the "percent" of health */
		pct = 100L * mon->hp / mon->maxhp;

		/* Badly wounded */
		if (pct >= 10) attr = COLOUR_L_RED;

		/* Wounded */
		if (pct >= 25) attr = COLOUR_ORANGE;

		/* Somewhat Wounded */
		if (pct >= 60) attr = COLOUR_YELLOW;

		/* Healthy */
		if (pct >= 100) attr = COLOUR_L_GREEN;

		/* Afraid */
		if (mon->m_timed[MON_TMD_FEAR]) attr = COLOUR_VIOLET;

		/* Disenchanted */
		if (mon->m_timed[MON_TMD_DISEN]) attr = COLOUR_L_UMBER;

		/* Commanded */
		if (mon->m_timed[MON_TMD_COMMAND]) attr = COLOUR_L_PURPLE;

		/* Confused */
		if (mon->m_timed[MON_TMD_CONF]) attr = COLOUR_UMBER;

		/* Stunned */
		if (mon->m_timed[MON_TMD_STUN]) attr = COLOUR_L_BLUE;

		/* Asleep */
		if (mon->m_timed[MON_TMD_SLEEP]) attr = COLOUR_BLUE;

		/* Held */
		if (mon->m_timed[MON_TMD_HOLD]) attr = COLOUR_BLUE;
	}

	return attr;
}